

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die_if_null.cc
# Opt level: O2

void absl::lts_20240722::log_internal::DieBecauseNull(char *file,int line,char *exprtext)

{
  size_t sVar1;
  LogMessage *this;
  LogMessageFatal *this_00;
  LogMessageFatal local_e0 [16];
  undefined1 local_d0 [80];
  AlphaNum local_80;
  AlphaNum local_50;
  
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/log/die_if_null.cc"
             ,0x1a);
  sVar1 = strlen(file);
  this = (LogMessage *)
         absl::lts_20240722::log_internal::LogMessage::AtLocation(local_e0,sVar1,file,line);
  local_50.piece_ = NullSafeStringView("Check failed: \'");
  local_80.piece_ = NullSafeStringView(exprtext);
  local_d0._32_16_ = (undefined1  [16])NullSafeStringView("\' Must be non-null");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_d0,&local_50,&local_80);
  absl::lts_20240722::log_internal::LogMessage::operator<<(this,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  this_00 = local_e0;
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(this_00);
  if (this_00 != (LogMessageFatal *)0x0) {
    strlen((char *)this_00);
  }
  return;
}

Assistant:

void DieBecauseNull(const char* file, int line, const char* exprtext) {
  LOG(FATAL).AtLocation(file, line)
      << absl::StrCat("Check failed: '", exprtext, "' Must be non-null");
}